

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  string *psVar2;
  uchar value;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  Message::Message((Message *)&local_60);
  if (str->_M_string_length != 0) {
    uVar6 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar6];
      switch(bVar1) {
      case 8:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        lVar3 = 2;
        pcVar4 = "\\b";
        break;
      case 9:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        lVar3 = 2;
        pcVar4 = "\\t";
        break;
      case 10:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        lVar3 = 2;
        pcVar4 = "\\n";
        break;
      case 0xb:
switchD_00126de0_caseD_b:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        if ('\x1f' < (char)bVar1) goto LAB_00126e3a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\u00",4);
        String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)bVar1,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),
                   (char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p)
                   ,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00126f0c;
      case 0xc:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        lVar3 = 2;
        pcVar4 = "\\f";
        break;
      case 0xd:
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
        lVar3 = 2;
        pcVar4 = "\\r";
        break;
      default:
        if ((0x3a < bVar1 - 0x22) ||
           ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0))
        goto switchD_00126de0_caseD_b;
        local_58._M_dataplus._M_p._0_1_ = 0x5c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),(char *)&local_58,1);
        poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
LAB_00126e3a:
        lVar3 = 1;
        pcVar4 = (char *)&local_58;
        local_58._M_dataplus._M_p._0_1_ = bVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
LAB_00126f0c:
      uVar6 = uVar6 + 1;
    } while (uVar6 < str->_M_string_length);
  }
  psVar2 = local_38;
  StringStreamToString(local_38,local_60._M_head_impl);
  if (local_60._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  return psVar2;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}